

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O2

void drawHexThin(ostream *out,double x,double y,double width,double height)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  std::operator<<(out,"\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"");
  std::operator<<(out,"M ");
  poVar1 = std::ostream::_M_insert<double>(x);
  std::operator<<(poVar1," ");
  dVar2 = height / 3.0 + y;
  std::ostream::_M_insert<double>(dVar2);
  std::operator<<(out," L ");
  poVar1 = std::ostream::_M_insert<double>(x);
  std::operator<<(poVar1," ");
  dVar3 = (height + height) / 3.0 + y;
  std::ostream::_M_insert<double>(dVar3);
  std::operator<<(out," L ");
  dVar4 = width * 0.5 + x;
  poVar1 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(height + y);
  std::operator<<(out," L ");
  poVar1 = std::ostream::_M_insert<double>(x + width);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(dVar3);
  std::operator<<(out," L ");
  poVar1 = std::ostream::_M_insert<double>(x + width);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(dVar2);
  std::operator<<(out," L ");
  poVar1 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(y);
  std::operator<<(out," z\"");
  std::operator<<(out,"/>\n");
  return;
}

Assistant:

void drawHexThin(ostream& out, double x, double y, double width,
		double height) {
	double& h = height;
	double& w = width;
	out << "\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"";
	out << "M "  << x           << " " << y+h/3.0;
	out << " L " << x           << " " << y+h*2.0/3.0;
	out << " L " << x+w/2.0     << " " << y+h;
	out << " L " << x+w         << " " << y+h*2.0/3.0;
	out << " L " << x+w         << " " << y+h/3.0;
	out << " L " << x+w/2.0     << " " << y;
	out << " z\"";
	out << "/>\n";
}